

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O1

bool __thiscall crnlib::dxt_image::has_alpha(dxt_image *this)

{
  dxt_format dVar1;
  element *peVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  
  dVar1 = this->m_format;
  if ((uint)dVar1 < 0xc) {
    if ((0xa1eU >> (dVar1 & 0x1f) & 1) != 0) {
      return true;
    }
    if (dVar1 == cDXT1) {
      uVar5 = (ulong)this->m_total_elements;
      bVar10 = uVar5 != 0;
      if (bVar10) {
        peVar2 = this->m_pElements;
        uVar7 = 0;
        do {
          if (*(ushort *)peVar2[uVar7].m_bytes <= *(ushort *)(peVar2[uVar7].m_bytes + 2)) {
            uVar8 = 0;
            bVar9 = false;
            do {
              if ((~peVar2[uVar7].m_bytes[uVar8 + 4] & 3) == 0) {
LAB_00196119:
                if (!bVar9) {
                  if (!bVar10) {
                    return false;
                  }
                  return true;
                }
                break;
              }
              uVar6 = 0xffffffff;
              bVar4 = 2;
              do {
                if (uVar6 == 2) goto LAB_00196102;
                bVar3 = bVar4 & 0x1f;
                uVar6 = uVar6 + 1;
                bVar4 = bVar4 + 2;
              } while ((~(peVar2[uVar7].m_bytes[uVar8 + 4] >> bVar3) & 3) != 0);
              if (uVar6 < 3) goto LAB_00196119;
LAB_00196102:
              bVar9 = 2 < uVar8;
              uVar8 = uVar8 + 1;
            } while (uVar8 != 4);
          }
          uVar7 = uVar7 + 1;
          bVar10 = uVar7 < uVar5;
        } while (uVar7 != uVar5);
      }
    }
  }
  return false;
}

Assistant:

bool dxt_image::has_alpha() const {
  switch (m_format) {
    case cDXT1: {
      for (uint i = 0; i < m_total_elements; i++) {
        const dxt1_block& blk = *(dxt1_block*)&m_pElements[i];

        if (blk.get_low_color() <= blk.get_high_color()) {
          for (uint y = 0; y < cDXTBlockSize; y++)
            for (uint x = 0; x < cDXTBlockSize; x++)
              if (blk.get_selector(x, y) == 3)
                return true;
        }
      }

      break;
    }
    case cDXT1A:
    case cDXT3:
    case cDXT5:
    case cDXT5A:
    case cETC2A:
    case cETC2AS:
      return true;
    default:
      break;
  }

  return false;
}